

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolver_sync.c
# Opt level: O3

void dns_resolver_destroy(DNSRESOLVER_HANDLE dns_in)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (dns_in != (DNSRESOLVER_HANDLE)0x0) {
    if (((*(char *)((long)dns_in + 0x10) == '\x01') && (*(char *)((long)dns_in + 0x11) == '\0')) &&
       (*(addrinfo **)((long)dns_in + 0x18) != (addrinfo *)0x0)) {
      freeaddrinfo(*(addrinfo **)((long)dns_in + 0x18));
    }
    if (*dns_in != (void *)0x0) {
      free(*dns_in);
    }
    free(dns_in);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/dns_resolver_sync.c"
               ,"dns_resolver_destroy",0xbe,1,"NULL dns");
    return;
  }
  return;
}

Assistant:

void dns_resolver_destroy(DNSRESOLVER_HANDLE dns_in)
{
    DNSRESOLVER_INSTANCE* dns = (DNSRESOLVER_INSTANCE*)dns_in;
    if (dns == NULL)
    {
        /* Codes_SRS_dns_resolver_30_050: [ If the dns parameter is NULL, dns_resolver_destroy shall log an error and do nothing. ]*/
        LogError("NULL dns");
    }
    else
    {
        /* Codes_SRS_dns_resolver_30_051: [ dns_resolver_destroy shall delete all acquired resources and delete the DNSRESOLVER_HANDLE. ]*/
        if(dns->is_complete && !dns->is_failed && dns->addrInfo != NULL)
        {
            freeaddrinfo(dns->addrInfo);
        }

        if(dns->hostname != NULL)
        {
            free(dns->hostname);
        }
        
        free(dns);
        dns = NULL;
    }
}